

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Observer.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  char *pcVar2;
  bool bVar3;
  Observer o_1;
  bool test_ok;
  Observer o;
  Observer *in_stack_00000090;
  undefined1 in_stack_ffffffffffffff9f;
  Observer *in_stack_ffffffffffffffa0;
  int *this;
  int *in_stack_ffffffffffffffd8;
  _func_void_int_ptr *in_stack_ffffffffffffffe0;
  int *in_stack_ffffffffffffffe8;
  duration f;
  
  x = 0;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1000000);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  f.__r = (rep)t0.__d.__r;
  depspawn::Observer::Observer(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  depspawn::spawn<void(int&),int&>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  depspawn::spawn<void(int&),int&>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  depspawn::spawn<void(int&),int&>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  depspawn::Observer::~Observer(in_stack_00000090);
  poVar1 = std::operator<<((ostream *)&std::cout,"x = ");
  this = &x;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  bVar3 = x == 0xc;
  depspawn::Observer::Observer((Observer *)this,(bool)in_stack_ffffffffffffff9f);
  depspawn::spawn<void(int&,bool&),int&,bool&>
            ((_func_void_int_ptr_bool_ptr *)f.__r,in_stack_ffffffffffffffe8,
             (bool *)in_stack_ffffffffffffffe0);
  depspawn::Observer::~Observer(in_stack_00000090);
  poVar1 = std::operator<<((ostream *)&std::cout,"TEST ");
  pcVar2 = "UNSUCCESSFUL";
  if (bVar3) {
    pcVar2 = "SUCCESSFUL";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return (int)((bVar3 ^ 0xffU) & 1);
}

Assistant:

int main()
{ 
  x = 0;
  
  std::cout << CLOCKS_PER_SEC << std::endl;

  t0 = std::chrono::high_resolution_clock::now();
  
  { Observer o;
    
    spawn(g, x); //Sets x to 1
    spawn(g, x); //Sets x to 2
    spawn(f, x); //Sets x to 12
  }

  std::cout << "x = " << x << std::endl;

  bool test_ok = (x == 12);

  { Observer o;
    
    spawn(h, x, test_ok);
  }
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}